

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

rx_status rx__test_failure_array_extend_back(rx_failure **slice,rx_failure **array,size_t size)

{
  long lVar1;
  size_t pos;
  void *block;
  size_t sStack_28;
  rx_status status;
  size_t size_local;
  rx_failure **array_local;
  rx_failure **slice_local;
  
  sStack_28 = size;
  size_local = (size_t)array;
  array_local = slice;
  if (array == (rx_failure **)0x0) {
    __assert_fail("array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1230,
                  "enum rx_status rx__test_failure_array_extend_back(struct rx_failure **, struct rx_failure **, size_t)"
                 );
  }
  if (*array != (rx_failure *)0x0) {
    pos = (size_t)&(*array)[-1].msg;
    block._4_4_ = rx__dyn_array_ensure_has_enough_capacity
                            ((void **)&pos,(size_t)(*array)[-1].diagnostic_msg,
                             (size_t)(*(char **)pos + size),0x7ffffffffffffff,0x20);
    if (block._4_4_ == RX_SUCCESS) {
      if (pos == 0) {
        __assert_fail("block != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x1242,
                      "enum rx_status rx__test_failure_array_extend_back(struct rx_failure **, struct rx_failure **, size_t)"
                     );
      }
      *(size_t *)size_local = pos + 0x10;
      lVar1 = *(long *)pos;
      memmove((void *)(*(long *)size_local + (lVar1 + sStack_28) * 0x20),
              (void *)(*(long *)size_local + lVar1 * 0x20),(*(long *)pos - lVar1) * 0x20);
      if (array_local != (rx_failure **)0x0) {
        *array_local = (rx_failure *)(*(long *)size_local + lVar1 * 0x20);
      }
      *(size_t *)pos = sStack_28 + *(long *)pos;
      slice_local._4_4_ = RX_SUCCESS;
    }
    else {
      rx__log(RX_LOG_LEVEL_ALL,
              "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
              ,0x123e,
              "failed to reserve a large enough capacity for the test failure array (requested capacity: %lu)\n"
              ,*(long *)pos + sStack_28);
      slice_local._4_4_ = block._4_4_;
    }
    return slice_local._4_4_;
  }
  __assert_fail("*array != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1231,
                "enum rx_status rx__test_failure_array_extend_back(struct rx_failure **, struct rx_failure **, size_t)"
               );
}

Assistant:

static enum rx_status
rx__test_failure_array_extend_back(struct rx_failure **slice,
                                   struct rx_failure **array,
                                   size_t size)
{
    enum rx_status status;
    void *block;
    size_t pos;

    RX_ASSERT(array != NULL);
    RX_ASSERT(*array != NULL);

    block = RX__DYN_ARRAY_GET_BLOCK(*array);
    status = rx__dyn_array_ensure_has_enough_capacity(
        &block,
        RX__DYN_ARRAY_GET_HEADER(block)->capacity,
        RX__DYN_ARRAY_GET_HEADER(block)->size + size,
        rx__test_failure_array_max_capacity,
        sizeof(struct rx_failure));
    if (status != RX_SUCCESS) {
        RX__LOG_DEBUG_1(
            "failed to reserve a large enough capacity for "
            "the test failure array (requested capacity: %lu)\n",
            (unsigned long)RX__DYN_ARRAY_GET_HEADER(block)->size + size);
        return status;
    }

    RX_ASSERT(block != NULL);

    *array = (struct rx_failure *)RX__DYN_ARRAY_GET_BUFFER(block);

    pos = RX__DYN_ARRAY_GET_HEADER(block)->size;
    memmove(&(*array)[pos + size],
            &(*array)[pos],
            sizeof(struct rx_failure)
                * (RX__DYN_ARRAY_GET_HEADER(block)->size - pos));

    if (slice != NULL) {
        *slice = &(*array)[pos];
    }

    RX__DYN_ARRAY_GET_HEADER(block)->size += size;
    return RX_SUCCESS;
}